

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Debug.cpp
# Opt level: O1

void __thiscall Corrade::Utility::StringStream::sync(StringStream *this)

{
  sync((StringStream *)&this[-1].field_0x170);
  return;
}

Assistant:

int sync() override {
            /* If sync() gets called multiple times without any overflow() in
               between, the data are owned by the string, not the array, and
               the remaining capacity is artificially set to 0 in a setp() call
               to prevent it from being appended to. Exit early in that case as
               there's nothing left to be done. */
            if(!_data)
                return 0;

            /* Resize to just what had been written, add a null terminator at
               the end */
            /** @todo clean up once the string is capable of growing */
            arrayResize(_data, NoInit, _initialSize + pptr() - pbase());
            arrayAppend(_data, '\0');

            /* The above might have reallocated, for example when the _data had
               no space for the null terminator. Call setp() to update the
               pointers, but don't leave any extra capacity to force overflow()
               to be called for next append, which then adopts the string back
               to the array. Otherwise it would be impossible to distinguish
               whether the string was modified by the stream (causing pptr() to
               change) or from outside (causing pptr() to point to an outdated
               location). */
            _initialSize = _data.size() - 1;
            setp(_data.end() - 1, _data.end() - 1);

            /* Move the array guts back to the string, making it one byte
               smaller as the last byte is the null terminator */
            const Containers::Array<char>::Deleter deleter = _data.deleter();
            _out = Containers::String{_data.release(), _initialSize, deleter};

            return 0;
        }